

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<int>::append(SmallVectorBase<int> *this,size_type count,int *value)

{
  size_type newCapacity;
  int temp;
  int local_24;
  
  newCapacity = this->len + count;
  reserve(this,newCapacity);
  std::ranges::__fill_n_fn::operator()<int,_int_*>
            ((__fill_n_fn *)&std::ranges::fill_n,this->data_ + this->len,count,&local_24);
  this->len = newCapacity;
  return;
}

Assistant:

void append(size_type count, const T& value) {
        // Make a temporary copy of the value in case it already lives inside our array.
        T temp(value);

        auto newSize = len + count;
        reserve(newSize);

        std::ranges::uninitialized_fill_n(end(), count, temp);
        len = newSize;
    }